

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soa_fsa.c
# Opt level: O0

void soa_fsa_free(soa_fsa_t *allocator,void *ptr)

{
  long lVar1;
  soa_chunk_t *local_48;
  soa_chunk_t *chunk;
  size_t i;
  uchar *p;
  uchar *b;
  uchar *a;
  size_t chunkSizeBytes;
  void *ptr_local;
  soa_fsa_t *allocator_local;
  
  lVar1 = allocator->blockSize * (ulong)allocator->numBlocks;
  if ((allocator->deallocChunk != (soa_chunk_t *)0x0) &&
     ((ptr < allocator->deallocChunk->blockData ||
      (allocator->deallocChunk->blockData + lVar1 < ptr)))) {
    allocator->deallocChunk = (soa_chunk_t *)0x0;
  }
  if (allocator->deallocChunk == (soa_chunk_t *)0x0) {
    chunk = (soa_chunk_t *)0x0;
    local_48 = allocator->chunks;
    for (; chunk < (soa_chunk_t *)allocator->chunks_len;
        chunk = (soa_chunk_t *)((long)&chunk->blockData + 1)) {
      if ((local_48->blockData <= ptr) && (ptr <= local_48->blockData + lVar1)) {
        allocator->deallocChunk = local_48;
        break;
      }
      local_48 = local_48 + 1;
    }
  }
  if (allocator->deallocChunk == (soa_chunk_t *)0x0) {
    __assert_fail("allocator->deallocChunk",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/soa_fsa.c"
                  ,0x84,"void soa_fsa_free(soa_fsa_t *, void *)");
  }
  soa_chunk_free(allocator->deallocChunk,ptr,allocator->blockSize);
  return;
}

Assistant:

void soa_fsa_free( soa_fsa_t *allocator, void* ptr )
{
  size_t chunkSizeBytes = allocator->blockSize*allocator->numBlocks;
  unsigned char *a, *b; //[a..b] is a (memory) range, where a is the first byte, and b is the last byte (in the range)
  unsigned char *p = (unsigned char*) ptr;
  
  if(allocator->deallocChunk) //Is this deallocation in the same chunk as last time?
  {
    a = allocator->deallocChunk->blockData;
    b = allocator->deallocChunk->blockData+chunkSizeBytes;
    if( (a <= p) && (p<=b)) //Does p fall in the range [a..b]?
    {
      //Do nothing (deallocChunk is valid)
    }
    else
    {
      allocator->deallocChunk = 0; //invalidate deallocChunk
    }
  }
  if(allocator->deallocChunk == 0)
  {
    //which chunk does p belong to? (linear search)
    size_t i;
    soa_chunk_t *chunk;
    for(i=0,chunk=allocator->chunks;i<allocator->chunks_len;i++,chunk++)
    {
      a = chunk->blockData;
      b = chunk->blockData+chunkSizeBytes;
      if( (a <= p) && (p<=b)) //Does p fall in the range [a..b]?
      {
        //Found it!
        allocator->deallocChunk = chunk;
        break;
      }
    }
  }
  assert(allocator->deallocChunk); //If this fails it means that ptr did not originate from this allocator
  soa_chunk_free(allocator->deallocChunk,ptr,allocator->blockSize);
}